

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseTableModuleField(WastParser *this,Module *module)

{
  ExprList *this_00;
  pointer ppTVar1;
  pointer ppTVar2;
  undefined1 auVar3 [8];
  Type TVar4;
  ElemSegmentModuleField *pEVar5;
  bool bVar6;
  Result RVar7;
  TokenType TVar8;
  reference pvVar9;
  size_type sVar10;
  pointer *__ptr;
  Enum EVar11;
  undefined8 uVar12;
  ExprListVector *this_01;
  undefined1 local_148 [8];
  Type elem_type;
  undefined8 local_138;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  anon_union_16_2_ecfd7102_for_Location_1 aStack_128;
  ElemSegmentModuleField *local_110;
  _Head_base<0UL,_wabt::TableModuleField_*,_false> local_108;
  _Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false> local_100;
  _Head_base<0UL,_wabt::TableModuleField_*,_false> local_f8;
  undefined1 local_f0 [16];
  undefined1 local_e0 [8];
  string name;
  Location loc;
  ExprList elem_expr;
  ModuleFieldList export_fields;
  
  RVar7 = Expect(this,Lpar);
  if (RVar7.enum_ == Error) {
    return (Result)Error;
  }
  GetLocation(&loc,this);
  RVar7 = Expect(this,Table);
  if (RVar7.enum_ == Error) {
    return (Result)Error;
  }
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  ParseBindVarOpt(this,&name);
  export_fields.first_ = (ModuleField *)0x0;
  export_fields.last_ = (ModuleField *)0x0;
  export_fields.size_ = 0;
  EVar11 = Error;
  RVar7 = ParseInlineExports(this,&export_fields,Table);
  if (RVar7.enum_ == Error) goto LAB_00136707;
  bVar6 = PeekMatchLpar(this,Import);
  if (bVar6) {
    CheckImportOrdering(this,module);
    std::make_unique<wabt::TableImport,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xfffffffffffffec8);
    RVar7 = ParseInlineImport(this,(Import *)local_138);
    uVar12 = local_138;
    if (((RVar7.enum_ == Error) ||
        (RVar7 = ParseLimits(this,(Limits *)(local_138 + 0x70)), uVar12 = local_138,
        RVar7.enum_ == Error)) ||
       (RVar7 = ParseRefType(this,(Type *)(local_138 + 0x88)), uVar12 = local_138,
       RVar7.enum_ == Error)) {
LAB_00136601:
      if ((Import *)uVar12 != (Import *)0x0) {
        (**(code **)(*(long *)uVar12 + 8))();
      }
      goto LAB_00136707;
    }
    GetLocation((Location *)&elem_expr,this);
    std::
    make_unique<wabt::ImportModuleField,std::unique_ptr<wabt::TableImport,std::default_delete<wabt::TableImport>>,wabt::Location>
              ((unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> *)&elem_type,
               (Location *)&stack0xfffffffffffffec8);
    local_e0._0_4_ = elem_type.enum_;
    local_e0._4_4_ = elem_type.type_index_;
    elem_type.enum_ = Any;
    elem_type.type_index_ = 0;
    Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                *)local_e0);
    if ((Type)local_e0 != (Type)0x0) {
      (**(code **)(*(long *)local_e0 + 8))();
    }
    local_e0 = (undefined1  [8])0x0;
    uVar12 = local_138;
    if (elem_type != (Type)0x0) {
      (**(code **)(*(long *)elem_type + 8))();
      uVar12 = local_138;
    }
LAB_001366c4:
    if ((Import *)uVar12 != (Import *)0x0) {
      (**(code **)(*(long *)uVar12 + 8))();
    }
  }
  else {
    TVar8 = Peek(this,0);
    if (TVar8 != First_Type) {
      std::make_unique<wabt::TableModuleField,wabt::Location&,std::__cxx11::string&>
                ((Location *)&elem_expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loc);
      RVar7 = ParseLimits(this,(Limits *)&elem_expr.first_[1].loc.filename._M_str);
      uVar12 = elem_expr.first_;
      if ((RVar7.enum_ == Error) ||
         (RVar7 = ParseRefType(this,(Type *)&elem_expr.first_[1].type_), uVar12 = elem_expr.first_,
         RVar7.enum_ == Error)) goto LAB_00136601;
      local_108._M_head_impl = (TableModuleField *)elem_expr.first_;
      elem_expr.first_ = (Expr *)0x0;
      Module::AppendField(module,(unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                                  *)&local_108);
      if (local_108._M_head_impl != (TableModuleField *)0x0) {
        (*((local_108._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).
          super_ModuleField._vptr_ModuleField[1])();
      }
      local_108._M_head_impl = (TableModuleField *)0x0;
      uVar12 = elem_expr.first_;
      goto LAB_001366c4;
    }
    RVar7 = ParseRefType(this,&elem_type);
    if (((RVar7.enum_ == Error) || (RVar7 = Expect(this,Lpar), RVar7.enum_ == Error)) ||
       (RVar7 = Expect(this,Elem), RVar7.enum_ == Error)) goto LAB_00136707;
    std::make_unique<wabt::ElemSegmentModuleField,wabt::Location&>((Location *)local_148);
    auVar3 = local_148;
    ppTVar1 = (module->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppTVar2 = (module->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    GetLocation((Location *)&stack0xfffffffffffffec8,this);
    Var::Var((Var *)&elem_expr,(Index)((ulong)((long)ppTVar1 - (long)ppTVar2) >> 3),
             (Location *)&stack0xfffffffffffffec8);
    Var::operator=(&((ElemSegment *)((long)auVar3 + 0x40))->table_var,(Var *)&elem_expr);
    Var::~Var((Var *)&elem_expr);
    local_110 = (ElemSegmentModuleField *)auVar3;
    this_00 = &((ElemSegment *)((long)auVar3 + 0x40))->offset;
    aStack_128.field_0.line = 0;
    aStack_128._4_8_ = 0;
    local_138 = 0;
    uStack_130 = 0;
    uStack_12c = 0;
    Const::I32((Const *)&elem_expr,0,(Location *)&stack0xfffffffffffffec8);
    std::make_unique<wabt::ConstExpr,wabt::Const>((Const *)local_f0);
    local_f0._8_8_ = local_f0._0_8_;
    local_f0._0_8_ = (long *)0x0;
    intrusive_list<wabt::Expr>::push_back
              (this_00,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)(local_f0 + 8));
    if ((long *)local_f0._8_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_f0._8_8_ + 8))();
    }
    local_f0._8_8_ = (char *)0x0;
    if ((long *)local_f0._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_f0._0_8_ + 8))();
    }
    pvVar9 = intrusive_list<wabt::Expr>::back(this_00);
    pEVar5 = local_110;
    TVar4 = elem_type;
    (pvVar9->loc).filename._M_len = loc.filename._M_len;
    (pvVar9->loc).filename._M_str = loc.filename._M_str;
    (pvVar9->loc).field_1.field_1.offset = (size_t)loc.field_1.field_1.offset;
    *(undefined8 *)((long)&(pvVar9->loc).field_1 + 8) = loc.field_1._8_8_;
    (local_110->elem_segment).elem_type = elem_type;
    elem_expr.first_ = (Expr *)0x0;
    elem_expr.last_ = (Expr *)0x0;
    elem_expr.size_ = 0;
    bVar6 = ParseElemExprOpt(this,&elem_expr);
    this_01 = &(pEVar5->elem_segment).elem_exprs;
    if (bVar6) {
      std::vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>
      ::emplace_back<wabt::intrusive_list<wabt::Expr>>
                ((vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>
                  *)this_01,&elem_expr);
      ParseElemExprListOpt(this,this_01);
    }
    else {
      ParseElemExprVarListOpt(this,this_01);
    }
    RVar7 = Expect(this,Rpar);
    if (RVar7.enum_ != Error) {
      std::make_unique<wabt::TableModuleField,wabt::Location&,std::__cxx11::string&>
                ((Location *)&stack0xfffffffffffffec8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loc);
      sVar10 = ((long)(local_110->elem_segment).elem_exprs.
                      super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_110->elem_segment).elem_exprs.
                     super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x18;
      *(size_type *)(local_138 + 0x60) = sVar10;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_138 + 0x68))->_M_allocated_capacity = sVar10;
      *(undefined1 *)(local_138 + 0x70) = 1;
      *(Type *)(local_138 + 0x78) = TVar4;
      local_f8._M_head_impl = (TableModuleField *)local_138;
      local_138 = 0;
      Module::AppendField(module,(unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                                  *)&local_f8);
      if (local_f8._M_head_impl != (TableModuleField *)0x0) {
        (*((local_f8._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).
          super_ModuleField._vptr_ModuleField[1])();
      }
      local_f8._M_head_impl = (TableModuleField *)0x0;
      local_100._M_head_impl = (ElemSegmentModuleField *)local_148;
      local_148 = (undefined1  [8])0x0;
      Module::AppendField(module,(unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                                  *)&local_100);
      if (local_100._M_head_impl != (ElemSegmentModuleField *)0x0) {
        (*((local_100._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).
          super_ModuleField._vptr_ModuleField[1])();
      }
      local_100._M_head_impl = (ElemSegmentModuleField *)0x0;
      if (local_138 != 0) {
        (**(code **)(*(long *)local_138 + 8))();
      }
    }
    intrusive_list<wabt::Expr>::clear(&elem_expr);
    if (local_148 != (undefined1  [8])0x0) {
      (*(((ModuleFieldMixin<(wabt::ModuleFieldType)6> *)local_148)->super_ModuleField).
        _vptr_ModuleField[1])();
    }
    if (RVar7.enum_ == Error) goto LAB_00136707;
  }
  anon_unknown_1::AppendInlineExportFields
            (module,&export_fields,
             (int)((ulong)((long)(module->tables).
                                 super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(module->tables).
                                super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
  RVar7 = Expect(this,Rpar);
  EVar11 = (Enum)(RVar7.enum_ == Error);
LAB_00136707:
  intrusive_list<wabt::ModuleField>::clear(&export_fields);
  std::__cxx11::string::_M_dispose();
  return (Result)EVar11;
}

Assistant:

Result WastParser::ParseTableModuleField(Module* module) {
  WABT_TRACE(ParseTableModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Table);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Table));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = std::make_unique<TableImport>(name);
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseLimits(&import->table.elem_limits));
    CHECK_RESULT(ParseRefType(&import->table.elem_type));
    auto field =
        std::make_unique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else if (PeekMatch(TokenType::ValueType)) {
    Type elem_type;
    CHECK_RESULT(ParseRefType(&elem_type));

    EXPECT(Lpar);
    EXPECT(Elem);

    auto elem_segment_field = std::make_unique<ElemSegmentModuleField>(loc);
    ElemSegment& elem_segment = elem_segment_field->elem_segment;
    elem_segment.table_var = Var(module->tables.size(), GetLocation());
    elem_segment.offset.push_back(std::make_unique<ConstExpr>(Const::I32(0)));
    elem_segment.offset.back().loc = loc;
    elem_segment.elem_type = elem_type;
    // Syntax is either an optional list of var (legacy), or a non-empty list
    // of elem expr.
    ExprList elem_expr;
    if (ParseElemExprOpt(&elem_expr)) {
      elem_segment.elem_exprs.push_back(std::move(elem_expr));
      // Parse the rest.
      ParseElemExprListOpt(&elem_segment.elem_exprs);
    } else {
      ParseElemExprVarListOpt(&elem_segment.elem_exprs);
    }
    EXPECT(Rpar);

    auto table_field = std::make_unique<TableModuleField>(loc, name);
    table_field->table.elem_limits.initial = elem_segment.elem_exprs.size();
    table_field->table.elem_limits.max = elem_segment.elem_exprs.size();
    table_field->table.elem_limits.has_max = true;
    table_field->table.elem_type = elem_type;
    module->AppendField(std::move(table_field));
    module->AppendField(std::move(elem_segment_field));
  } else {
    auto field = std::make_unique<TableModuleField>(loc, name);
    CHECK_RESULT(ParseLimits(&field->table.elem_limits));
    CHECK_RESULT(ParseRefType(&field->table.elem_type));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->tables.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}